

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

int enet_protocol_handle_acknowledge
              (ENetHost *host,ENetEvent *event,ENetPeer *peer,ENetProtocol *command)

{
  ENetPeerState EVar1;
  uint16_t uVar2;
  uint uVar3;
  ENetProtocolCommand EVar4;
  uint32_t local_54;
  uint local_50;
  uint32_t local_4c;
  uint32_t diff_1;
  uint32_t diff;
  ENetProtocolCommand commandNumber;
  uint32_t receivedReliableSequenceNumber;
  uint32_t receivedSentTime;
  uint32_t roundTripTime;
  ENetProtocol *command_local;
  ENetPeer *peer_local;
  ENetEvent *event_local;
  ENetHost *host_local;
  
  if ((peer->state == ENET_PEER_STATE_DISCONNECTED) || (peer->state == ENET_PEER_STATE_ZOMBIE)) {
    return 0;
  }
  uVar2 = ntohs((command->acknowledge).receivedSentTime);
  commandNumber = host->serviceTime & 0xffff0000 | (uint)uVar2;
  if ((host->serviceTime & 0x8000) < (uVar2 & 0x8000)) {
    commandNumber = commandNumber - 0x10000;
  }
  if (86399999 < host->serviceTime - commandNumber) {
    return 0;
  }
  if (host->serviceTime - commandNumber < 86400000) {
    local_4c = host->serviceTime - commandNumber;
  }
  else {
    local_4c = commandNumber - host->serviceTime;
  }
  receivedReliableSequenceNumber = local_4c;
  if (local_4c == 0) {
    receivedReliableSequenceNumber = 1;
  }
  enet_peer_throttle(peer,receivedReliableSequenceNumber);
  if (peer->lastReceiveTime == 0) {
    peer->roundTripTime = receivedReliableSequenceNumber;
    peer->roundTripTimeVariance = receivedReliableSequenceNumber >> 1;
  }
  else if (receivedReliableSequenceNumber < peer->roundTripTime) {
    uVar3 = peer->roundTripTime - receivedReliableSequenceNumber;
    if (peer->roundTripTimeVariance < uVar3) {
      peer->roundTripTimeVariance = peer->roundTripTimeVariance - (peer->roundTripTimeVariance >> 5)
      ;
      peer->roundTripTimeVariance = (uVar3 >> 5) + peer->roundTripTimeVariance;
    }
    else {
      peer->roundTripTimeVariance = peer->roundTripTimeVariance - (peer->roundTripTimeVariance >> 2)
      ;
      peer->roundTripTimeVariance = (uVar3 >> 2) + peer->roundTripTimeVariance;
    }
    peer->roundTripTime = peer->roundTripTime - (uVar3 >> 3);
  }
  else {
    uVar3 = receivedReliableSequenceNumber - peer->roundTripTime;
    peer->roundTripTimeVariance = peer->roundTripTimeVariance - (peer->roundTripTimeVariance >> 2);
    peer->roundTripTimeVariance = (uVar3 >> 2) + peer->roundTripTimeVariance;
    peer->roundTripTime = (uVar3 >> 3) + peer->roundTripTime;
  }
  if (peer->roundTripTime < peer->lowestRoundTripTime) {
    peer->lowestRoundTripTime = peer->roundTripTime;
  }
  if (peer->highestRoundTripTimeVariance < peer->roundTripTimeVariance) {
    peer->highestRoundTripTimeVariance = peer->roundTripTimeVariance;
  }
  if (peer->packetThrottleEpoch != 0) {
    if (host->serviceTime - peer->packetThrottleEpoch < 86400000) {
      local_50 = host->serviceTime - peer->packetThrottleEpoch;
    }
    else {
      local_50 = peer->packetThrottleEpoch - host->serviceTime;
    }
    if (local_50 < peer->packetThrottleInterval) goto LAB_00109f4e;
  }
  peer->lastRoundTripTime = peer->lowestRoundTripTime;
  peer->lastRoundTripTimeVariance = peer->highestRoundTripTimeVariance;
  peer->lowestRoundTripTime = peer->roundTripTime;
  peer->highestRoundTripTimeVariance = peer->roundTripTimeVariance;
  peer->packetThrottleEpoch = host->serviceTime;
LAB_00109f4e:
  if (host->serviceTime < 2) {
    local_54 = 1;
  }
  else {
    local_54 = host->serviceTime;
  }
  peer->lastReceiveTime = local_54;
  peer->earliestTimeout = 0;
  uVar2 = ntohs((command->acknowledge).receivedReliableSequenceNumber);
  EVar4 = enet_protocol_remove_sent_reliable_command(peer,uVar2,(command->header).channelID);
  EVar1 = peer->state;
  if (EVar1 == ENET_PEER_STATE_ACKNOWLEDGING_CONNECT) {
    if (EVar4 != ENET_PROTOCOL_COMMAND_VERIFY_CONNECT) {
      return -1;
    }
    enet_protocol_notify_connect(host,peer,event);
  }
  else if (EVar1 == ENET_PEER_STATE_DISCONNECT_LATER) {
    if (((peer->outgoingCommands).sentinel.next == &(peer->outgoingCommands).sentinel) &&
       ((peer->sentReliableCommands).sentinel.next == &(peer->sentReliableCommands).sentinel)) {
      enet_peer_disconnect(peer,peer->eventData);
    }
  }
  else if (EVar1 == ENET_PEER_STATE_DISCONNECTING) {
    if (EVar4 != ENET_PROTOCOL_COMMAND_DISCONNECT) {
      return -1;
    }
    enet_protocol_notify_disconnect(host,peer,event);
  }
  return 0;
}

Assistant:

static int enet_protocol_handle_acknowledge(ENetHost* host, ENetEvent* event, ENetPeer* peer, const ENetProtocol* command) {
	uint32_t roundTripTime, receivedSentTime, receivedReliableSequenceNumber;
	ENetProtocolCommand commandNumber;

	if (peer->state == ENET_PEER_STATE_DISCONNECTED || peer->state == ENET_PEER_STATE_ZOMBIE)
		return 0;

	receivedSentTime = ENET_NET_TO_HOST_16(command->acknowledge.receivedSentTime);
	receivedSentTime |= host->serviceTime & 0xFFFF0000;

	if ((receivedSentTime & 0x8000) > (host->serviceTime & 0x8000))
		receivedSentTime -= 0x10000;

	if (ENET_TIME_LESS(host->serviceTime, receivedSentTime))
		return 0;

	roundTripTime = ENET_TIME_DIFFERENCE(host->serviceTime, receivedSentTime);

	if (roundTripTime == 0)
		roundTripTime = 1;

	enet_peer_throttle(peer, roundTripTime);

	if (peer->lastReceiveTime > 0) {
		if (roundTripTime >= peer->roundTripTime) {
			uint32_t diff = roundTripTime - peer->roundTripTime;
			peer->roundTripTimeVariance -= peer->roundTripTimeVariance / 4;
			peer->roundTripTimeVariance += diff / 4;
			peer->roundTripTime += diff / 8;
		}
		else {
			uint32_t diff = peer->roundTripTime - roundTripTime;

			if (diff <= peer->roundTripTimeVariance) {
				peer->roundTripTimeVariance -= peer->roundTripTimeVariance / 4;
				peer->roundTripTimeVariance += diff / 4;
			}
			else {
				peer->roundTripTimeVariance -= peer->roundTripTimeVariance / 32;
				peer->roundTripTimeVariance += diff / 32;
			}

			peer->roundTripTime -= diff / 8;
		}
	}
	else {
		peer->roundTripTime = roundTripTime;
		peer->roundTripTimeVariance = roundTripTime / 2;
	}

	if (peer->roundTripTime < peer->lowestRoundTripTime)
		peer->lowestRoundTripTime = peer->roundTripTime;

	if (peer->roundTripTimeVariance > peer->highestRoundTripTimeVariance)
		peer->highestRoundTripTimeVariance = peer->roundTripTimeVariance;

	if (peer->packetThrottleEpoch == 0 || ENET_TIME_DIFFERENCE(host->serviceTime, peer->packetThrottleEpoch) >= peer->packetThrottleInterval) {
		peer->lastRoundTripTime = peer->lowestRoundTripTime;
		peer->lastRoundTripTimeVariance = peer->highestRoundTripTimeVariance;
		peer->lowestRoundTripTime = peer->roundTripTime;
		peer->highestRoundTripTimeVariance = peer->roundTripTimeVariance;
		peer->packetThrottleEpoch = host->serviceTime;
	}

	peer->lastReceiveTime = ENET_MAX(host->serviceTime, 1);
	peer->earliestTimeout = 0;

	receivedReliableSequenceNumber = ENET_NET_TO_HOST_16(command->acknowledge.receivedReliableSequenceNumber);
	commandNumber = enet_protocol_remove_sent_reliable_command(peer, receivedReliableSequenceNumber, command->header.channelID);

	switch (peer->state) {
	case ENET_PEER_STATE_ACKNOWLEDGING_CONNECT:
		if (commandNumber != ENET_PROTOCOL_COMMAND_VERIFY_CONNECT) {
			ENET_LOG_ERROR("Wrong command number. Got %u vs %u.", commandNumber, ENET_PROTOCOL_COMMAND_VERIFY_CONNECT);
			return -1;
		}

		enet_protocol_notify_connect(host, peer, event);

		break;

	case ENET_PEER_STATE_DISCONNECTING:
		if (commandNumber != ENET_PROTOCOL_COMMAND_DISCONNECT) {
			ENET_LOG_ERROR("Wrong command number. Got %u vs %u.", commandNumber, ENET_PROTOCOL_COMMAND_VERIFY_CONNECT);
			return -1;
		}

		enet_protocol_notify_disconnect(host, peer, event);

		break;

	case ENET_PEER_STATE_DISCONNECT_LATER:
		if (enet_list_empty(&peer->outgoingCommands) && enet_list_empty(&peer->sentReliableCommands))
			enet_peer_disconnect(peer, peer->eventData);

		break;

	default:
		break;
	}

	return 0;
}